

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

void __thiscall Quest_Context::Quest_Context(Quest_Context *this,Character *character,Quest *quest)

{
  Quest *quest_00;
  Quest *quest_local;
  Character *character_local;
  Quest_Context *this_local;
  
  quest_00 = Quest::GetQuest(quest);
  EOPlus::Context::Context(&this->super_Context,quest_00);
  (this->super_Context)._vptr_Context = (_func_int **)&PTR_BeginState_002c5a10;
  this->character = character;
  this->quest = quest;
  std::__cxx11::string::string((string *)&this->state_desc);
  std::
  map<short,_std::shared_ptr<Dialog>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
  ::map(&this->dialogs);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  ::map(&this->progress);
  return;
}

Assistant:

Quest_Context::Quest_Context(Character* character, const Quest* quest)
	: Context(quest->GetQuest())
	, character(character)
	, quest(quest)
{ }